

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int matchQuality(FuncDef *p,int nArg,u8 enc)

{
  bool bVar1;
  int local_24;
  int match;
  u8 enc_local;
  int nArg_local;
  FuncDef *p_local;
  
  if (nArg == -2) {
    bVar1 = false;
    if (p->xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
      bVar1 = p->xStep == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
    }
    p_local._4_4_ = 6;
    if (bVar1) {
      p_local._4_4_ = 0;
    }
  }
  else if ((p->nArg == nArg) || (p->nArg < 0)) {
    if (p->nArg == nArg) {
      local_24 = 4;
    }
    else {
      local_24 = 1;
    }
    if (enc == p->iPrefEnc) {
      local_24 = local_24 + 2;
    }
    else if ((enc & p->iPrefEnc & 2) != 0) {
      local_24 = local_24 + 1;
    }
    p_local._4_4_ = local_24;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int matchQuality(
  FuncDef *p,     /* The function we are evaluating for match quality */
  int nArg,       /* Desired number of arguments.  (-1)==any */
  u8 enc          /* Desired text encoding */
){
  int match;

  /* nArg of -2 is a special case */
  if( nArg==(-2) ) return (p->xFunc==0 && p->xStep==0) ? 0 : FUNC_PERFECT_MATCH;

  /* Wrong number of arguments means "no match" */
  if( p->nArg!=nArg && p->nArg>=0 ) return 0;

  /* Give a better score to a function with a specific number of arguments
  ** than to function that accepts any number of arguments. */
  if( p->nArg==nArg ){
    match = 4;
  }else{
    match = 1;
  }

  /* Bonus points if the text encoding matches */
  if( enc==p->iPrefEnc ){
    match += 2;  /* Exact encoding match */
  }else if( (enc & p->iPrefEnc & 2)!=0 ){
    match += 1;  /* Both are UTF16, but with different byte orders */
  }

  return match;
}